

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StandardShapes.cpp
# Opt level: O2

void Assimp::StandardShapes::MakeCircle
               (ai_real radius,uint tess,
               vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *positions)

{
  uint in_XMM0_Db;
  uint in_XMM0_Dc;
  uint in_XMM0_Dd;
  float local_48;
  float local_44;
  aiVector3t<float> local_40;
  float local_30;
  float local_2c;
  ai_real local_28;
  uint uStack_24;
  uint uStack_20;
  uint uStack_1c;
  
  local_30 = 0.0;
  if (radius != 0.0 && 2 < tess) {
    local_28 = ABS(radius);
    uStack_24 = in_XMM0_Db & 0x7fffffff;
    uStack_20 = in_XMM0_Dc & 0x7fffffff;
    uStack_1c = in_XMM0_Dd & 0x7fffffff;
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
              (positions,
               (ulong)(tess * 3) +
               ((long)(positions->
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)(positions->
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                     _M_impl.super__Vector_impl_data._M_start) / 0xc);
    local_2c = 6.2831855 / (float)tess;
    local_44 = 1.0;
    local_48 = 0.0;
    while (local_48 < 6.2831855) {
      local_40.z = local_30 * local_28;
      local_40.y = 0.0;
      local_40.x = local_44 * local_28;
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      emplace_back<aiVector3t<float>>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,&local_40)
      ;
      local_48 = local_48 + local_2c;
      local_44 = cosf(local_48);
      local_30 = sinf(local_48);
      local_40.z = local_30 * local_28;
      local_40.y = 0.0;
      local_40.x = local_44 * local_28;
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      emplace_back<aiVector3t<float>>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,&local_40)
      ;
      local_40.x = 0.0;
      local_40.y = 0.0;
      local_40.z = 0.0;
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      emplace_back<aiVector3t<float>>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,&local_40)
      ;
    }
  }
  return;
}

Assistant:

void StandardShapes::MakeCircle(ai_real radius, unsigned int tess,
    std::vector<aiVector3D>& positions)
{
    // Sorry, a circle with less than 3 segments makes ABSOLUTELY NO SENSE
    if (tess < 3 || !radius)
        return;

    radius = std::fabs(radius);

    // We will need 3 vertices per segment
    positions.reserve(positions.size()+tess*3);

    const ai_real angle_delta = (ai_real)AI_MATH_TWO_PI / tess;
    const ai_real angle_max   = (ai_real)AI_MATH_TWO_PI;

    ai_real s = 1.0; // std::cos(angle == 0);
    ai_real t = 0.0; // std::sin(angle == 0);

    for (ai_real angle = 0.0; angle < angle_max;  )
    {
        positions.push_back(aiVector3D(s * radius,0.0,t * radius));
        angle += angle_delta;
        s = std::cos(angle);
        t = std::sin(angle);
        positions.push_back(aiVector3D(s * radius,0.0,t * radius));

        positions.push_back(aiVector3D(0.0,0.0,0.0));
    }
}